

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Types TVar3;
  ulong *puVar4;
  long lVar5;
  string *psVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ExecutionModel EVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  SPIRType *pSVar13;
  SPIRType *pSVar14;
  undefined4 extraout_var;
  undefined8 *puVar15;
  undefined4 extraout_var_00;
  long *plVar16;
  SPIRVariable *var;
  runtime_error *prVar17;
  size_type *psVar18;
  ulong *puVar19;
  ulong uVar20;
  uint uVar21;
  CompilerMSL *pCVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  bool bVar25;
  AccessChainMeta meta;
  string expr;
  uint32_t indices [2];
  string local_138;
  SPIRType *local_118;
  AccessChainMeta local_110;
  ulong local_100;
  long lStack_f8;
  CompilerMSL *local_f0;
  uint32_t local_e8;
  uint32_t local_e4;
  ulong local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  SPIRType *local_78;
  uint32_t local_6c;
  SPIRType *local_68;
  SPIRType *local_60;
  uint32_t local_54;
  SPIRType *local_50;
  uint32_t local_44;
  SPIRVariable *local_40;
  ulong local_38;
  
  pSVar13 = Compiler::expression_type((Compiler *)this,ptr);
  pSVar14 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + result_type_id);
  local_f0 = this;
  local_50 = pSVar13;
  if (((pSVar13->storage != Input) &&
      ((pSVar13->storage != Output ||
       (EVar10 = Compiler::get_execution_model((Compiler *)this),
       EVar10 == ExecutionModelTessellationEvaluation)))) ||
     (bVar7 = Compiler::has_decoration((Compiler *)this,(ID)ptr,DecorationPatch), bVar7)) {
    return false;
  }
  TVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[ptr].type;
  local_e4 = ptr;
  local_54 = id;
  local_44 = result_type_id;
  bVar7 = variable_storage_requires_stage_io(this,local_50->storage);
  if (bVar7) {
    bVar8 = Compiler::is_matrix((Compiler *)this,pSVar14);
    bVar25 = true;
    if ((!bVar8) && (bVar8 = Compiler::is_array((Compiler *)this,pSVar14), !bVar8)) {
      bVar25 = pSVar14->basetype == Struct;
    }
  }
  else {
    bVar25 = false;
  }
  bVar8 = bVar25;
  if (TVar3 == TypeVariable) {
    bVar9 = Compiler::is_array((Compiler *)local_f0,pSVar14);
    bVar8 = true;
    if (!bVar9) {
      bVar8 = bVar25;
    }
  }
  uVar12 = local_e4;
  pCVar22 = local_f0;
  if (!bVar8) {
    return false;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_118 = pSVar14;
  uVar11 = Compiler::get_extended_decoration
                     ((Compiler *)local_f0,local_e4,SPIRVCrossDecorationInterfaceMemberIndex);
  local_e0 = CONCAT44(extraout_var,uVar11);
  local_40 = Compiler::maybe_get_backing_variable((Compiler *)pCVar22,uVar12);
  local_68 = Compiler::get_pointee_type((Compiler *)pCVar22,(local_50->super_IVariant).self.id);
  local_60 = Compiler::expression_type((Compiler *)pCVar22,(pCVar22->stage_in_ptr_var_id).id);
  pCVar22 = local_f0;
  if (bVar7) {
    uVar20 = (local_118->array).super_VectorView<unsigned_int>.buffer_size;
    if (2 < uVar20) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"Cannot load tessellation IO variables with more than 2 dimensions.");
      goto LAB_002383c3;
    }
    if (uVar20 == 2) {
      if (TVar3 != TypeVariable) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Loading an array-of-array must be loaded directly from an IO variable.")
        ;
LAB_002383c3:
        *(undefined ***)prVar17 = &PTR__runtime_error_0049deb0;
        __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((int)local_e0 == -1) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar17,"Interface index is unknown. Cannot continue.");
        goto LAB_002383c3;
      }
      if ((local_118->basetype == Struct) ||
         (bVar7 = Compiler::is_matrix((Compiler *)local_f0,local_118), bVar7)) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Cannot load array-of-array of composite type in tessellation IO.");
        goto LAB_002383c3;
      }
      (*(pCVar22->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_110,pCVar22,local_118,0);
      puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar18 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_138.field_2._M_allocated_capacity = *psVar18;
        local_138.field_2._8_8_ = puVar15[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar18;
        local_138._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_138._M_string_length = puVar15[1];
      *puVar15 = psVar18;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
        operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
      }
      pSVar13 = local_118;
      uVar11 = CompilerGLSL::to_array_size_literal(&pCVar22->super_CompilerGLSL,local_118,1);
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((pCVar22->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar13->parent_type).id);
      if (uVar11 != 0) {
        local_e8 = 0;
        local_78 = (SPIRType *)CONCAT44(local_78._4_4_,uVar11);
        do {
          pCVar22 = local_f0;
          (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_110,local_f0,pSVar13,0);
          puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
          psVar18 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138.field_2._8_8_ = puVar15[3];
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_138._M_string_length = puVar15[1];
          *puVar15 = psVar18;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
            operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
          }
          uVar12 = CompilerGLSL::to_array_size_literal(&pCVar22->super_CompilerGLSL,local_118,0);
          if (uVar12 != 0) {
            uVar20 = local_e0 & 0xffffffff;
            uVar21 = 1;
            do {
              local_98._M_dataplus._M_p._0_4_ = local_e8;
              local_110.builtin = BuiltInPosition;
              local_110.storage_physical_type = 0;
              local_110.need_transpose = false;
              local_110.storage_is_packed = false;
              local_110.storage_is_invariant = false;
              local_110.flattened_struct = false;
              local_110.relaxed_precision = false;
              local_110.access_meshlet_position_y = false;
              local_110.chain_is_builtin = false;
              local_98._M_dataplus._M_p._4_4_ = (uint32_t)uVar20;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_138,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id
                         ,(uint32_t *)&local_98,2,5,&local_110);
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              bVar7 = Compiler::is_matrix((Compiler *)local_f0,pSVar13);
              if ((!bVar7 && pSVar13->basetype != Struct) && (pSVar13->vecsize < local_68->vecsize))
              {
                CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              if (uVar21 < uVar12) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              uVar20 = (ulong)((uint32_t)uVar20 + 1);
              bVar7 = uVar21 != uVar12;
              uVar21 = uVar21 + 1;
            } while (bVar7);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar21 = (uint)local_78;
          local_e8 = local_e8 + 1;
          if (local_e8 < (uint)local_78) {
            ::std::__cxx11::string::append((char *)&local_b8);
          }
          uVar12 = local_e4;
        } while (local_e8 != uVar21);
      }
      ::std::__cxx11::string::append((char *)&local_b8);
    }
    else if (local_118->basetype == Struct) {
      bVar7 = Compiler::is_array((Compiler *)local_f0,local_118);
      pSVar13 = local_118;
      local_e8 = CONCAT31(local_e8._1_3_,bVar7);
      if ((TVar3 != TypeVariable) && (bVar7)) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,
                   "Loading array of struct from IO variable must come directly from IO variable.");
        *(undefined ***)prVar17 = &PTR__runtime_error_0049deb0;
        __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_6c = 1;
      if (bVar7) {
        local_6c = CompilerGLSL::to_array_size_literal(&pCVar22->super_CompilerGLSL,local_118,0);
        (*(pCVar22->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_110,pCVar22,pSVar13,0);
        puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        psVar18 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_138.field_2._M_allocated_capacity = *psVar18;
          local_138.field_2._8_8_ = puVar15[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar18;
          local_138._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_138._M_string_length = puVar15[1];
        *puVar15 = psVar18;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        uVar12 = local_e4;
        if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
          operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
        }
      }
      if ((char)local_e8 != '\0') {
        local_118 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar22->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (local_118->parent_type).id);
        pCVar22 = local_f0;
      }
      if ((local_118->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                      ,0x206d,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      if (local_6c != 0) {
        local_78 = (SPIRType *)((ulong)local_78 & 0xffffffff00000000);
        do {
          (*(pCVar22->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_110,pCVar22,local_118,0);
          puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          psVar18 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138.field_2._8_8_ = puVar15[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_138._M_string_length = puVar15[1];
          *puVar15 = psVar18;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
            operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
          }
          if ((int)(local_118->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0)
          {
            uVar20 = 0;
            do {
              if (local_40 != (SPIRVariable *)0x0) {
                uVar11 = Compiler::get_extended_member_decoration
                                   ((Compiler *)pCVar22,(local_40->super_IVariant).self.id,
                                    (uint32_t)uVar20,SPIRVCrossDecorationInterfaceMemberIndex);
                local_e0 = CONCAT44(extraout_var_00,uVar11);
              }
              if ((int)local_e0 == -1) {
                prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error
                          (prVar17,"Interface index is unknown. Cannot continue.");
                *(undefined ***)prVar17 = &PTR__runtime_error_0049deb0;
                __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              pSVar13 = Variant::get<spirv_cross::SPIRType>
                                  ((pCVar22->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (local_118->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[uVar20].id);
              local_38 = uVar20;
              pSVar14 = Variant::get<spirv_cross::SPIRType>
                                  ((pCVar22->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (local_68->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[uVar20].id);
              bVar7 = Compiler::is_matrix((Compiler *)pCVar22,pSVar13);
              if (bVar7 && local_50->storage == Input) {
                (*(pCVar22->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_110,pCVar22,pSVar13,0);
                puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                psVar18 = puVar15 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar15 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_138.field_2._M_allocated_capacity = *psVar18;
                  local_138.field_2._8_8_ = puVar15[3];
                }
                else {
                  local_138.field_2._M_allocated_capacity = *psVar18;
                  local_138._M_dataplus._M_p = (pointer)*puVar15;
                }
                local_138._M_string_length = puVar15[1];
                *puVar15 = psVar18;
                puVar15[1] = 0;
                *(undefined1 *)(puVar15 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                }
                if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
                  operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
                }
                if (pSVar13->columns != 0) {
                  uVar21 = 0;
                  do {
                    uVar11 = (int)local_e0 + uVar21;
                    if ((char)local_e8 == '\0') {
                      CompilerGLSL::to_expression_abi_cxx11_
                                (&local_98,&local_f0->super_CompilerGLSL,uVar12,true);
                      plVar16 = (long *)::std::__cxx11::string::append((char *)&local_98);
                      local_110._0_7_ = SUB87(&local_100,0);
                      local_110.flattened_struct = SUB81((ulong)&local_100 >> 0x38,0);
                      puVar4 = (ulong *)*plVar16;
                      puVar19 = (ulong *)(plVar16 + 2);
                      if (puVar4 == puVar19) {
                        local_100 = *puVar19;
                        lStack_f8 = plVar16[3];
                      }
                      else {
                        local_110._0_7_ = SUB87(puVar4,0);
                        local_110.flattened_struct = SUB81((ulong)puVar4 >> 0x38,0);
                        local_100 = *puVar19;
                      }
                      lVar5 = plVar16[1];
                      local_110._8_3_ = SUB83(lVar5,0);
                      local_110._11_1_ = SUB81((ulong)lVar5 >> 0x18,0);
                      local_110.builtin = (BuiltIn)((ulong)lVar5 >> 0x20);
                      *plVar16 = (long)puVar19;
                      plVar16[1] = 0;
                      *(undefined1 *)(plVar16 + 2) = 0;
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_d8,&local_f0->super_CompilerGLSL,local_60,uVar11);
                      uVar20 = 0xf;
                      if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) !=
                          &local_100) {
                        uVar20 = local_100;
                      }
                      uVar1 = local_d8._M_string_length +
                              CONCAT44(local_110.builtin,CONCAT13(local_110._11_1_,local_110._8_3_))
                      ;
                      if (uVar20 < uVar1) {
                        uVar23 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                          uVar23 = local_d8.field_2._M_allocated_capacity;
                        }
                        if ((ulong)uVar23 < uVar1) goto LAB_00237309;
                        puVar15 = (undefined8 *)
                                  ::std::__cxx11::string::replace
                                            ((ulong)&local_d8,0,(char *)0x0,
                                             CONCAT17(local_110.flattened_struct,local_110._0_7_));
                      }
                      else {
LAB_00237309:
                        puVar15 = (undefined8 *)
                                  ::std::__cxx11::string::_M_append
                                            ((char *)&local_110,(ulong)local_d8._M_dataplus._M_p);
                      }
                      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                      psVar18 = puVar15 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar15 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_138.field_2._M_allocated_capacity = *psVar18;
                        local_138.field_2._8_8_ = puVar15[3];
                      }
                      else {
                        local_138.field_2._M_allocated_capacity = *psVar18;
                        local_138._M_dataplus._M_p = (pointer)*puVar15;
                      }
                      local_138._M_string_length = puVar15[1];
                      *puVar15 = psVar18;
                      puVar15[1] = 0;
                      *(undefined1 *)psVar18 = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                        operator_delete(local_138._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                        operator_delete(local_d8._M_dataplus._M_p);
                      }
                      if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) !=
                          &local_100) {
                        operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_
                                                         ));
                      }
                      _Var24._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                      (uint32_t)local_98._M_dataplus._M_p);
                      psVar6 = &local_98;
                    }
                    else {
                      local_98._M_dataplus._M_p._0_4_ = (uint)local_78;
                      local_110.builtin = BuiltInPosition;
                      local_110.storage_physical_type = 0;
                      local_110.need_transpose = false;
                      local_110.storage_is_packed = false;
                      local_110.storage_is_invariant = false;
                      local_110.flattened_struct = false;
                      local_110.relaxed_precision = false;
                      local_110.access_meshlet_position_y = false;
                      local_110.chain_is_builtin = false;
                      local_98._M_dataplus._M_p._4_4_ = uVar11;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                (&local_138,&local_f0->super_CompilerGLSL,
                                 (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                                 &local_110);
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                      psVar6 = &local_138;
                      _Var24._M_p = local_138._M_dataplus._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var24._M_p != &psVar6->field_2) {
                      operator_delete(_Var24._M_p);
                    }
                    if (pSVar13->vecsize < pSVar14->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                      ::std::__cxx11::string::append((char *)&local_b8);
                    }
                    uVar21 = uVar21 + 1;
                    if (uVar21 < pSVar13->columns) {
                      ::std::__cxx11::string::append((char *)&local_b8);
                    }
                  } while (uVar21 < pSVar13->columns);
                  local_e0 = (ulong)((int)local_e0 + uVar21);
                }
                ::std::__cxx11::string::append((char *)&local_b8);
                pCVar22 = local_f0;
              }
              else {
                bVar7 = Compiler::is_array((Compiler *)pCVar22,pSVar13);
                if (bVar7) {
                  (*(pCVar22->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_110,pCVar22,pSVar13,0);
                  puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  psVar18 = puVar15 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar15 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_138.field_2._M_allocated_capacity = *psVar18;
                    local_138.field_2._8_8_ = puVar15[3];
                  }
                  else {
                    local_138.field_2._M_allocated_capacity = *psVar18;
                    local_138._M_dataplus._M_p = (pointer)*puVar15;
                  }
                  local_138._M_string_length = puVar15[1];
                  *puVar15 = psVar18;
                  puVar15[1] = 0;
                  *(undefined1 *)(puVar15 + 2) = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p);
                  }
                  if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
                    operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
                  }
                  uVar12 = CompilerGLSL::to_array_size_literal
                                     (&pCVar22->super_CompilerGLSL,pSVar13,0);
                  if (uVar12 != 0) {
                    uVar21 = 1;
                    do {
                      if ((char)local_e8 == '\0') {
                        CompilerGLSL::to_expression_abi_cxx11_
                                  (&local_98,&local_f0->super_CompilerGLSL,local_e4,true);
                        puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                        local_110._0_7_ = SUB87(&local_100,0);
                        local_110.flattened_struct = SUB81((ulong)&local_100 >> 0x38,0);
                        puVar4 = (ulong *)*puVar15;
                        puVar19 = puVar15 + 2;
                        if (puVar4 == puVar19) {
                          local_100 = *puVar19;
                          lStack_f8 = puVar15[3];
                        }
                        else {
                          local_110._0_7_ = SUB87(puVar4,0);
                          local_110.flattened_struct = SUB81((ulong)puVar4 >> 0x38,0);
                          local_100 = *puVar19;
                        }
                        uVar23 = puVar15[1];
                        local_110._8_3_ = SUB83(uVar23,0);
                        local_110._11_1_ = SUB81((ulong)uVar23 >> 0x18,0);
                        local_110.builtin = (BuiltIn)((ulong)uVar23 >> 0x20);
                        *puVar15 = puVar19;
                        puVar15[1] = 0;
                        *(undefined1 *)(puVar15 + 2) = 0;
                        CompilerGLSL::to_member_name_abi_cxx11_
                                  (&local_d8,&local_f0->super_CompilerGLSL,local_60,
                                   (uint32_t)local_e0);
                        uVar20 = 0xf;
                        if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) !=
                            &local_100) {
                          uVar20 = local_100;
                        }
                        uVar1 = local_d8._M_string_length +
                                CONCAT44(local_110.builtin,
                                         CONCAT13(local_110._11_1_,local_110._8_3_));
                        if (uVar20 < uVar1) {
                          uVar23 = 0xf;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                            uVar23 = local_d8.field_2._M_allocated_capacity;
                          }
                          if ((ulong)uVar23 < uVar1) goto LAB_00237697;
                          puVar15 = (undefined8 *)
                                    ::std::__cxx11::string::replace
                                              ((ulong)&local_d8,0,(char *)0x0,
                                               CONCAT17(local_110.flattened_struct,local_110._0_7_))
                          ;
                        }
                        else {
LAB_00237697:
                          puVar15 = (undefined8 *)
                                    ::std::__cxx11::string::_M_append
                                              ((char *)&local_110,(ulong)local_d8._M_dataplus._M_p);
                        }
                        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                        psVar18 = puVar15 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar15 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar18) {
                          local_138.field_2._M_allocated_capacity = *psVar18;
                          local_138.field_2._8_8_ = puVar15[3];
                        }
                        else {
                          local_138.field_2._M_allocated_capacity = *psVar18;
                          local_138._M_dataplus._M_p = (pointer)*puVar15;
                        }
                        local_138._M_string_length = puVar15[1];
                        *puVar15 = psVar18;
                        puVar15[1] = 0;
                        *(undefined1 *)psVar18 = 0;
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138._M_dataplus._M_p != &local_138.field_2) {
                          operator_delete(local_138._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                          operator_delete(local_d8._M_dataplus._M_p);
                        }
                        if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) !=
                            &local_100) {
                          operator_delete((ulong *)CONCAT17(local_110.flattened_struct,
                                                            local_110._0_7_));
                        }
                        _Var24._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                        (uint32_t)local_98._M_dataplus._M_p);
                        psVar6 = &local_98;
                      }
                      else {
                        local_98._M_dataplus._M_p._0_4_ = (uint)local_78;
                        local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
                        local_110.builtin = BuiltInPosition;
                        local_110.storage_physical_type = 0;
                        local_110.need_transpose = false;
                        local_110.storage_is_packed = false;
                        local_110.storage_is_invariant = false;
                        local_110.flattened_struct = false;
                        local_110.relaxed_precision = false;
                        local_110.access_meshlet_position_y = false;
                        local_110.chain_is_builtin = false;
                        CompilerGLSL::access_chain_internal_abi_cxx11_
                                  (&local_138,&local_f0->super_CompilerGLSL,
                                   (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                                   &local_110);
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                        psVar6 = &local_138;
                        _Var24._M_p = local_138._M_dataplus._M_p;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var24._M_p != &psVar6->field_2) {
                        operator_delete(_Var24._M_p);
                      }
                      if (pSVar13->vecsize < pSVar14->vecsize) {
                        CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                        ::std::__cxx11::string::append((char *)&local_b8);
                      }
                      if (uVar21 < uVar12) {
                        ::std::__cxx11::string::append((char *)&local_b8);
                      }
                      local_e0 = (ulong)((int)local_e0 + 1);
                      bVar7 = uVar21 != uVar12;
                      uVar21 = uVar21 + 1;
                    } while (bVar7);
                  }
                  ::std::__cxx11::string::append((char *)&local_b8);
                  pCVar22 = local_f0;
                  uVar12 = local_e4;
                }
                else {
                  if ((char)local_e8 == '\0') {
                    CompilerGLSL::to_expression_abi_cxx11_
                              (&local_98,&pCVar22->super_CompilerGLSL,uVar12,true);
                    puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                    local_110._0_7_ = SUB87(&local_100,0);
                    local_110.flattened_struct = SUB81((ulong)&local_100 >> 0x38,0);
                    puVar4 = (ulong *)*puVar15;
                    puVar19 = puVar15 + 2;
                    if (puVar4 == puVar19) {
                      local_100 = *puVar19;
                      lStack_f8 = puVar15[3];
                    }
                    else {
                      local_110._0_7_ = SUB87(puVar4,0);
                      local_110.flattened_struct = SUB81((ulong)puVar4 >> 0x38,0);
                      local_100 = *puVar19;
                    }
                    uVar23 = puVar15[1];
                    local_110._8_3_ = SUB83(uVar23,0);
                    local_110._11_1_ = SUB81((ulong)uVar23 >> 0x18,0);
                    local_110.builtin = (BuiltIn)((ulong)uVar23 >> 0x20);
                    *puVar15 = puVar19;
                    puVar15[1] = 0;
                    *(undefined1 *)(puVar15 + 2) = 0;
                    CompilerGLSL::to_member_name_abi_cxx11_
                              (&local_d8,&pCVar22->super_CompilerGLSL,local_60,(uint32_t)local_e0);
                    uVar20 = 0xf;
                    if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100)
                    {
                      uVar20 = local_100;
                    }
                    uVar1 = local_d8._M_string_length +
                            CONCAT44(local_110.builtin,CONCAT13(local_110._11_1_,local_110._8_3_));
                    if (uVar20 < uVar1) {
                      uVar23 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                        uVar23 = local_d8.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar23 < uVar1) goto LAB_00237874;
                      puVar15 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_d8,0,(char *)0x0,
                                           CONCAT17(local_110.flattened_struct,local_110._0_7_));
                    }
                    else {
LAB_00237874:
                      puVar15 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)&local_110,(ulong)local_d8._M_dataplus._M_p);
                    }
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    psVar18 = puVar15 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar15 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_138.field_2._M_allocated_capacity = *psVar18;
                      local_138.field_2._8_8_ = puVar15[3];
                    }
                    else {
                      local_138.field_2._M_allocated_capacity = *psVar18;
                      local_138._M_dataplus._M_p = (pointer)*puVar15;
                    }
                    local_138._M_string_length = puVar15[1];
                    *puVar15 = psVar18;
                    puVar15[1] = 0;
                    *(undefined1 *)psVar18 = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                      operator_delete(local_d8._M_dataplus._M_p);
                    }
                    if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100)
                    {
                      operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_))
                      ;
                    }
                    _Var24._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                    (uint32_t)local_98._M_dataplus._M_p);
                    psVar6 = &local_98;
                  }
                  else {
                    local_98._M_dataplus._M_p._0_4_ = (uint)local_78;
                    local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
                    local_110.builtin = BuiltInPosition;
                    local_110.storage_physical_type = 0;
                    local_110.need_transpose = false;
                    local_110.storage_is_packed = false;
                    local_110.storage_is_invariant = false;
                    local_110.flattened_struct = false;
                    local_110.relaxed_precision = false;
                    local_110.access_meshlet_position_y = false;
                    local_110.chain_is_builtin = false;
                    CompilerGLSL::access_chain_internal_abi_cxx11_
                              (&local_138,&pCVar22->super_CompilerGLSL,
                               (pCVar22->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                               &local_110);
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                    psVar6 = &local_138;
                    _Var24._M_p = local_138._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var24._M_p != &psVar6->field_2) {
                    operator_delete(_Var24._M_p);
                  }
                  if (pSVar13->vecsize < pSVar14->vecsize) {
                    CompilerGLSL::vector_swizzle(pSVar13->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b8);
                  }
                }
              }
              uVar20 = local_38 + 1;
              if (uVar20 < (local_118->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
            } while (uVar20 < (uint)(local_118->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                    buffer_size);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar21 = (uint)local_78 + 1;
          local_78 = (SPIRType *)CONCAT44(local_78._4_4_,uVar21);
          if (uVar21 < local_6c) {
            ::std::__cxx11::string::append((char *)&local_b8);
          }
        } while ((uint)local_78 != local_6c);
      }
      if ((char)local_e8 != '\0') {
        ::std::__cxx11::string::append((char *)&local_b8);
      }
    }
    else {
      bVar7 = Compiler::is_matrix((Compiler *)local_f0,local_118);
      if (bVar7) {
        bVar7 = Compiler::is_array((Compiler *)local_f0,local_118);
        pCVar22 = local_f0;
        pSVar13 = local_118;
        if ((TVar3 != TypeVariable) && (bVar7)) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                    );
LAB_00238478:
          *(undefined ***)prVar17 = &PTR__runtime_error_0049deb0;
          __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((int)local_e0 == -1) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"Interface index is unknown. Cannot continue.");
          goto LAB_00238478;
        }
        if (bVar7) {
          local_e8 = CompilerGLSL::to_array_size_literal(&local_f0->super_CompilerGLSL,local_118,0);
          (*(pCVar22->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_110,pCVar22,pSVar13,0);
          puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          psVar18 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138.field_2._8_8_ = puVar15[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_138._M_string_length = puVar15[1];
          *puVar15 = psVar18;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
            operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
          }
          var = Variant::get<spirv_cross::SPIRVariable>
                          ((pCVar22->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + ptr);
          local_78 = Compiler::get_variable_element_type((Compiler *)local_f0,var);
          if (local_e8 != 0) {
            uVar12 = 0;
            do {
              (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_110,local_f0,local_78,0);
              puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
              psVar18 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_138.field_2._M_allocated_capacity = *psVar18;
                local_138.field_2._8_8_ = puVar15[3];
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              }
              else {
                local_138.field_2._M_allocated_capacity = *psVar18;
                local_138._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_138._M_string_length = puVar15[1];
              *puVar15 = psVar18;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
                operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
              }
              if (local_118->columns != 0) {
                uVar21 = 0;
                do {
                  local_98._M_dataplus._M_p._4_4_ = (int)local_e0 + uVar21;
                  local_110.builtin = BuiltInPosition;
                  local_110.storage_physical_type = 0;
                  local_110.need_transpose = false;
                  local_110.storage_is_packed = false;
                  local_110.storage_is_invariant = false;
                  local_110.flattened_struct = false;
                  local_110.relaxed_precision = false;
                  local_110.access_meshlet_position_y = false;
                  local_110.chain_is_builtin = false;
                  local_98._M_dataplus._M_p._0_4_ = uVar12;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_138,&local_f0->super_CompilerGLSL,
                             (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,&local_110
                            );
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p);
                  }
                  if (local_118->vecsize < local_68->vecsize) {
                    CompilerGLSL::vector_swizzle(local_118->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b8);
                  }
                  uVar21 = uVar21 + 1;
                  if (uVar21 < local_118->columns) {
                    ::std::__cxx11::string::append((char *)&local_b8);
                  }
                } while (uVar21 < local_118->columns);
              }
              ::std::__cxx11::string::append((char *)&local_b8);
              uVar12 = uVar12 + 1;
              if (uVar12 < local_e8) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
            } while (uVar12 != local_e8);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar12 = local_e4;
        }
        else {
          (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_110,local_f0,local_118,0);
          puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
          paVar2 = &local_138.field_2;
          psVar18 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138.field_2._8_8_ = puVar15[3];
            local_138._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar18;
            local_138._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_138._M_string_length = puVar15[1];
          *puVar15 = psVar18;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
            operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
          }
          if (local_118->columns != 0) {
            uVar21 = 0;
            do {
              CompilerGLSL::to_expression_abi_cxx11_
                        (&local_98,&local_f0->super_CompilerGLSL,local_e4,true);
              puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
              local_110._0_7_ = SUB87(&local_100,0);
              local_110.flattened_struct = SUB81((ulong)&local_100 >> 0x38,0);
              puVar4 = (ulong *)*puVar15;
              puVar19 = puVar15 + 2;
              if (puVar4 == puVar19) {
                local_100 = *puVar19;
                lStack_f8 = puVar15[3];
              }
              else {
                local_110._0_7_ = SUB87(puVar4,0);
                local_110.flattened_struct = SUB81((ulong)puVar4 >> 0x38,0);
                local_100 = *puVar19;
              }
              uVar23 = puVar15[1];
              local_110._8_3_ = SUB83(uVar23,0);
              local_110._11_1_ = SUB81((ulong)uVar23 >> 0x18,0);
              local_110.builtin = (BuiltIn)((ulong)uVar23 >> 0x20);
              *puVar15 = puVar19;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_d8,&local_f0->super_CompilerGLSL,local_60,(int)local_e0 + uVar21);
              uVar20 = 0xf;
              if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
                uVar20 = local_100;
              }
              uVar1 = local_d8._M_string_length +
                      CONCAT44(local_110.builtin,CONCAT13(local_110._11_1_,local_110._8_3_));
              if (uVar20 < uVar1) {
                uVar23 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  uVar23 = local_d8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar23 < uVar1) goto LAB_00237b7c;
                puVar15 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_d8,0,(char *)0x0,
                                     CONCAT17(local_110.flattened_struct,local_110._0_7_));
              }
              else {
LAB_00237b7c:
                puVar15 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)&local_110,(ulong)local_d8._M_dataplus._M_p);
              }
              psVar18 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_138.field_2._M_allocated_capacity = *psVar18;
                local_138.field_2._8_8_ = puVar15[3];
                local_138._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_138.field_2._M_allocated_capacity = *psVar18;
                local_138._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_138._M_string_length = puVar15[1];
              *puVar15 = psVar18;
              puVar15[1] = 0;
              *(undefined1 *)psVar18 = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != paVar2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
                operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint32_t)local_98._M_dataplus._M_p)
                  != &local_98.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                         (uint32_t)local_98._M_dataplus._M_p));
              }
              if (local_118->vecsize < local_68->vecsize) {
                CompilerGLSL::vector_swizzle(local_118->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              uVar21 = uVar21 + 1;
              if (uVar21 < local_118->columns) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
            } while (uVar21 < local_118->columns);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar12 = local_e4;
        }
      }
      else if (TVar3 == TypeVariable) {
        bVar7 = Compiler::is_array((Compiler *)local_f0,local_118);
        pCVar22 = local_f0;
        if (!bVar7) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2101,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_118->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2102,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e0 == -1) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"Interface index is unknown. Cannot continue.");
          goto LAB_002383c3;
        }
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_110,local_f0,local_118,0);
        puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        paVar2 = &local_138.field_2;
        psVar18 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_138.field_2._M_allocated_capacity = *psVar18;
          local_138.field_2._8_8_ = puVar15[3];
          local_138._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar18;
          local_138._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_138._M_string_length = puVar15[1];
        *puVar15 = psVar18;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
          operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
        }
        uVar12 = CompilerGLSL::to_array_size_literal(&pCVar22->super_CompilerGLSL,local_118,0);
        if (uVar12 != 0) {
          uVar11 = 0;
          do {
            local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
            local_110.builtin = BuiltInPosition;
            local_110.storage_physical_type = 0;
            local_110.need_transpose = false;
            local_110.storage_is_packed = false;
            local_110.storage_is_invariant = false;
            local_110.flattened_struct = false;
            local_110.relaxed_precision = false;
            local_110.access_meshlet_position_y = false;
            local_110.chain_is_builtin = false;
            local_98._M_dataplus._M_p._0_4_ = uVar11;
            CompilerGLSL::access_chain_internal_abi_cxx11_
                      (&local_138,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id,
                       (uint32_t *)&local_98,2,5,&local_110);
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            if (local_118->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_118->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b8);
            }
            uVar11 = uVar11 + 1;
            if (uVar11 < uVar12) {
              ::std::__cxx11::string::append((char *)&local_b8);
            }
          } while (uVar12 != uVar11);
        }
        ::std::__cxx11::string::append((char *)&local_b8);
        uVar12 = local_e4;
      }
      else {
        bVar7 = Compiler::is_array((Compiler *)local_f0,local_118);
        pCVar22 = local_f0;
        if (!bVar7) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x211d,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_118->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x211e,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e0 == -1) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"Interface index is unknown. Cannot continue.");
          goto LAB_002383c3;
        }
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_110,local_f0,local_118,0);
        puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        paVar2 = &local_138.field_2;
        psVar18 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_138.field_2._M_allocated_capacity = *psVar18;
          local_138.field_2._8_8_ = puVar15[3];
          local_138._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar18;
          local_138._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_138._M_string_length = puVar15[1];
        *puVar15 = psVar18;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
          operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
        }
        uVar12 = CompilerGLSL::to_array_size_literal(&pCVar22->super_CompilerGLSL,local_118,0);
        if (uVar12 != 0) {
          uVar21 = 0;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_98,&local_f0->super_CompilerGLSL,local_e4,true);
            puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
            local_110._0_7_ = SUB87(&local_100,0);
            local_110.flattened_struct = SUB81((ulong)&local_100 >> 0x38,0);
            puVar4 = (ulong *)*puVar15;
            puVar19 = puVar15 + 2;
            if (puVar4 == puVar19) {
              local_100 = *puVar19;
              lStack_f8 = puVar15[3];
            }
            else {
              local_110._0_7_ = SUB87(puVar4,0);
              local_110.flattened_struct = SUB81((ulong)puVar4 >> 0x38,0);
              local_100 = *puVar19;
            }
            uVar23 = puVar15[1];
            local_110._8_3_ = SUB83(uVar23,0);
            local_110._11_1_ = SUB81((ulong)uVar23 >> 0x18,0);
            local_110.builtin = (BuiltIn)((ulong)uVar23 >> 0x20);
            *puVar15 = puVar19;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_d8,&local_f0->super_CompilerGLSL,local_60,(int)local_e0 + uVar21);
            uVar20 = 0xf;
            if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
              uVar20 = local_100;
            }
            uVar1 = local_d8._M_string_length +
                    CONCAT44(local_110.builtin,CONCAT13(local_110._11_1_,local_110._8_3_));
            if (uVar20 < uVar1) {
              uVar23 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar23 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar23 < uVar1) goto LAB_002381e2;
              puVar15 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_d8,0,(char *)0x0,
                                   CONCAT17(local_110.flattened_struct,local_110._0_7_));
            }
            else {
LAB_002381e2:
              puVar15 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_110,(ulong)local_d8._M_dataplus._M_p);
            }
            psVar18 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_138.field_2._M_allocated_capacity = *psVar18;
              local_138.field_2._8_8_ = puVar15[3];
              local_138._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar18;
              local_138._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_138._M_string_length = puVar15[1];
            *puVar15 = psVar18;
            puVar15[1] = 0;
            *(undefined1 *)psVar18 = 0;
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
              operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint32_t)local_98._M_dataplus._M_p) !=
                &local_98.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_98._M_dataplus._M_p));
            }
            if (local_118->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_118->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b8);
            }
            uVar21 = uVar21 + 1;
            if (uVar21 < uVar12) {
              ::std::__cxx11::string::append((char *)&local_b8);
            }
          } while (uVar12 != uVar21);
        }
        ::std::__cxx11::string::append((char *)&local_b8);
        uVar12 = local_e4;
      }
    }
  }
  else {
    if ((int)local_e0 == -1) {
      bVar7 = false;
      goto LAB_00236c2b;
    }
    (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&local_110,local_f0,local_118,0);
    puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
    paVar2 = &local_138.field_2;
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_138.field_2._M_allocated_capacity = *psVar18;
      local_138.field_2._8_8_ = puVar15[3];
      local_138._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar18;
      local_138._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_138._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_) != &local_100) {
      operator_delete((ulong *)CONCAT17(local_110.flattened_struct,local_110._0_7_));
    }
    uVar12 = CompilerGLSL::to_array_size_literal
                       (&pCVar22->super_CompilerGLSL,local_118,
                        (int)(local_118->array).super_VectorView<unsigned_int>.buffer_size - 1);
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
        local_110.builtin = BuiltInPosition;
        local_110.storage_physical_type = 0;
        local_110.need_transpose = false;
        local_110.storage_is_packed = false;
        local_110.storage_is_invariant = false;
        local_110.flattened_struct = false;
        local_110.relaxed_precision = false;
        local_110.access_meshlet_position_y = false;
        local_110.chain_is_builtin = false;
        local_98._M_dataplus._M_p._0_4_ = uVar11;
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  (&local_138,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id,
                   (uint32_t *)&local_98,2,5,&local_110);
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        uVar11 = uVar11 + 1;
        if (uVar11 < uVar12) {
          ::std::__cxx11::string::append((char *)&local_b8);
        }
      } while (uVar12 != uVar11);
    }
    ::std::__cxx11::string::append((char *)&local_b8);
    uVar12 = local_e4;
  }
  pCVar22 = local_f0;
  CompilerGLSL::emit_op(&local_f0->super_CompilerGLSL,local_44,local_54,&local_b8,false,false);
  bVar7 = true;
  Compiler::register_read((Compiler *)pCVar22,local_54,uVar12,false);
LAB_00236c2b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}